

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

void printHelp(void)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\x1b[93mUsage: \x1b[0m[<Options>] <number_of_puzzles>:\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tProgram options are: \n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\t\t\x1b[96m--rows <num>\t\x1b[0mSpecify the number of rows for the matrix, with \'<num>\' in the range [\x1b[32m7 \x1b[0m,\x1b[32m16 \x1b[0m]. The default value is 10.\n"
             ,0x92);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\t\t\x1b[96m--cols <num>\t\x1b[0mSpecify the number of columns for the matrix, with \'<num>\' in the range [\x1b[32m7 \x1b[0m,\x1b[32m16 \x1b[0m]. The default value is 10.\n"
             ,0x95);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tRequested input: \n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\t\t<number_of_puzzles> the number of puzzles to be generated, in the range [1, 100].\n"
             ,0x54);
  return;
}

Assistant:

void printHelp()
{
       std::cout << "\x1b[93mUsage: \x1b[0m[<Options>] <number_of_puzzles>:\n"
                  << "\tProgram options are: \n" 
                  << "\t\t\x1b[96m--rows <num>	\x1b[0mSpecify the number of rows for the matrix, with '<num>' in the range [\x1b[32m7 \x1b[0m,\x1b[32m16 \x1b[0m]. The default value is 10.\n"
                  << "\t\t\x1b[96m--cols <num>	\x1b[0mSpecify the number of columns for the matrix, with '<num>' in the range [\x1b[32m7 \x1b[0m,\x1b[32m16 \x1b[0m]. The default value is 10.\n"
                  << "\tRequested input: \n"
                  << "\t\t<number_of_puzzles> the number of puzzles to be generated, in the range [1, 100].\n";
}